

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O0

void __thiscall ResourceManager::destroy(ResourceManager *this)

{
  bool bVar1;
  reference ppRVar2;
  vector<Resource_*,_std::allocator<Resource_*>_> *in_RDI;
  Resource *r;
  reverse_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
  *in_stack_ffffffffffffffb8;
  ResourceManager *pRVar3;
  Resource *in_stack_ffffffffffffffc0;
  
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
  ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
                      *)0x1158cd);
  std::vector<Resource_*,_std::allocator<Resource_*>_>::rbegin(in_RDI);
  while( true ) {
    std::vector<Resource_*,_std::allocator<Resource_*>_>::rend(in_RDI);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
                             *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppRVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
                           *)in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = *ppRVar2;
    (**in_stack_ffffffffffffffc0->_vptr_Resource)();
    if (in_stack_ffffffffffffffc0 != (Resource *)0x0) {
      (*in_stack_ffffffffffffffc0->_vptr_Resource[4])();
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<Resource_**,_std::vector<Resource_*,_std::allocator<Resource_*>_>_>_>
                  *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  std::vector<Resource_*,_std::allocator<Resource_*>_>::clear
            ((vector<Resource_*,_std::allocator<Resource_*>_> *)0x115960);
  if (rm != (ResourceManager *)0x0) {
    pRVar3 = rm;
    ~ResourceManager((ResourceManager *)0x11597a);
    operator_delete(pRVar3,0x18);
  }
  rm = (ResourceManager *)0x0;
  return;
}

Assistant:

void ResourceManager::destroy(void)
{
   std::vector<Resource*>::reverse_iterator it;
  
   for (it = resources.rbegin(); it != resources.rend(); it++) {
      Resource* r = *it;
      r->destroy();
      delete r;
   }

   resources.clear();

   delete rm;
   rm = 0;
}